

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astIfNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  undefined1 local_88 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_e241f3bb gcFrame;
  sysbvm_astIfNode_t **ifNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,8);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  local_88 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_88);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),*psVar2);
  _Var1 = sysbvm_tuple_boolean_decode((sysbvm_tuple_t)gcFrameRecord.roots);
  if (_Var1) {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_88);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    if (*(long *)(*arguments + 0x30) == 0) {
      context_local = (sysbvm_context_t *)0x2f;
    }
    else {
      context_local =
           (sysbvm_context_t *)
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,*(sysbvm_tuple_t *)(*arguments + 0x30),*psVar2);
    }
  }
  else {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_88);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    if (*(long *)(*arguments + 0x38) == 0) {
      context_local = (sysbvm_context_t *)0x2f;
    }
    else {
      context_local =
           (sysbvm_context_t *)
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,*(sysbvm_tuple_t *)(*arguments + 0x38),*psVar2);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIfNode_t **ifNode = (sysbvm_astIfNode_t**)node;
    struct {
        sysbvm_tuple_t condition;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*ifNode)->super.sourcePosition);
    gcFrame.condition = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*ifNode)->conditionExpression, *environment);
    if(sysbvm_tuple_boolean_decode(gcFrame.condition))
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        if(!(*ifNode)->trueExpression)
            return SYSBVM_VOID_TUPLE;
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*ifNode)->trueExpression, *environment);
    }
    else
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        if(!(*ifNode)->falseExpression)
            return SYSBVM_VOID_TUPLE;
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*ifNode)->falseExpression, *environment);
    }
}